

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O1

char * Corrade::Containers::ArrayMallocAllocator<char>::allocate(size_t capacity)

{
  size_t *psVar1;
  Debug *pDVar2;
  char *__size;
  long in_FS_OFFSET;
  Error local_38;
  char *local_10;
  
  __size = (char *)(capacity + 8);
  psVar1 = (size_t *)malloc((size_t)__size);
  if (psVar1 != (size_t *)0x0) {
    *psVar1 = (size_t)__size;
    return (char *)(psVar1 + 1);
  }
  local_38.super_Debug._previousGlobalOutput = *(ostream **)(in_FS_OFFSET + -0x20);
  local_38.super_Debug._flags._value = '\0';
  local_38.super_Debug._immediateFlags._value = '\x04';
  local_38.super_Debug._internalFlags._value = 0;
  local_38.super_Debug._sourceLocationLine = 0;
  local_38.super_Debug._sourceLocationFile = (char *)0x0;
  local_38.super_Debug._previousColor = *(Color *)(in_FS_OFFSET + -8);
  if (*(char *)(in_FS_OFFSET + -7) == '\x01') {
    local_38.super_Debug._internalFlags._value = 8;
  }
  if (*(char *)(in_FS_OFFSET + -6) == '\x01') {
    local_38.super_Debug._internalFlags._value = local_38.super_Debug._internalFlags._value | 0x10;
  }
  local_38._previousGlobalErrorOutput = *(ostream **)(in_FS_OFFSET + -0x10);
  local_38.super_Debug._output = (ostream *)&std::cerr;
  *(undefined8 **)(in_FS_OFFSET + -0x10) = &std::cerr;
  local_10 = "Containers::ArrayMallocAllocator: can\'t allocate";
  pDVar2 = Utility::Debug::print<char_const*>(&local_38.super_Debug,&local_10);
  local_10 = __size;
  pDVar2 = Utility::Debug::print<unsigned_long>(pDVar2,(unsigned_long *)&local_10);
  Utility::Debug::operator<<(pDVar2,"bytes");
  Utility::Error::~Error(&local_38);
  abort();
}

Assistant:

static T* allocate(std::size_t capacity) {
        /* Compared to ArrayNewAllocator, here the capacity is stored in bytes
           so it's possible to "reinterpret" the array into a different type
           (as the deleter is a typeless std::free() in any case) */
        const std::size_t inBytes = capacity*sizeof(T) + AllocationOffset;
        char* const memory = static_cast<char*>(std::malloc(inBytes));
        CORRADE_ASSERT(memory,
            "Containers::ArrayMallocAllocator: can't allocate" << inBytes << "bytes", {});
        reinterpret_cast<std::size_t*>(memory)[0] = inBytes;
        return reinterpret_cast<T*>(memory + AllocationOffset);
    }